

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BgzfStream_p.cpp
# Opt level: O1

void __thiscall BamTools::Internal::BgzfStream::BgzfStream(BgzfStream *this)

{
  char *pcVar1;
  
  this->m_blockLength = 0;
  this->m_blockOffset = 0;
  this->m_blockAddress = 0;
  this->m_isWriteCompressed = true;
  this->m_device = (IBamIODevice *)0x0;
  pcVar1 = (char *)operator_new__(0x10000);
  memset(pcVar1,0,0x10000);
  (this->m_uncompressedBlock).Buffer = pcVar1;
  (this->m_uncompressedBlock).NumBytes = 0x10000;
  pcVar1 = (char *)operator_new__(0x10000);
  memset(pcVar1,0,0x10000);
  (this->m_compressedBlock).Buffer = pcVar1;
  (this->m_compressedBlock).NumBytes = 0x10000;
  return;
}

Assistant:

BgzfStream::BgzfStream()
    : m_blockLength(0)
    , m_blockOffset(0)
    , m_blockAddress(0)
    , m_isWriteCompressed(true)
    , m_device(0)
    , m_uncompressedBlock(Constants::BGZF_DEFAULT_BLOCK_SIZE)
    , m_compressedBlock(Constants::BGZF_MAX_BLOCK_SIZE)
{}